

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O1

void __thiscall BindPolymerase::Execute(BindPolymerase *this)

{
  int iVar1;
  int iVar2;
  SpeciesTracker *pSVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar4;
  shared_ptr<Polymerase> new_pol;
  Ptr polymer;
  undefined1 local_51;
  Polymerase *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  Polymerase *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined1 local_30 [32];
  
  Bind::ChoosePolymer((Bind *)local_30);
  local_50 = (Polymerase *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Polymerase,std::allocator<Polymerase>,Polymerase_const&>
            (&local_48,&local_50,(allocator<Polymerase> *)&local_51,&this->pol_template_);
  std::__shared_ptr<Polymerase,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<Polymerase,Polymerase>
            ((__shared_ptr<Polymerase,(__gnu_cxx::_Lock_policy)2> *)&local_50,local_50);
  local_40 = local_50;
  local_38 = local_48._M_pi;
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(_func_int **)local_30._0_8_ + 8))
            (local_30._0_8_,&local_40,&(this->super_Bind).promoter_name_);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  pSVar3 = SpeciesTracker::Instance();
  local_30._24_8_ = *(_func_int **)(local_30._0_8_ + 0x58);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_)->_M_use_count;
    do {
      if (iVar2 == 0) {
        local_30._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_)->_M_use_count;
      bVar4 = iVar2 == iVar1;
      if (bVar4) {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_)->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar4);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_)->_M_use_count == 0;
  }
  if (bVar4) {
    local_30._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_30._16_8_ = *(_func_int **)(local_30._0_8_ + 0x50);
  }
  Signal<std::shared_ptr<Reaction>_>::Emit
            (&pSVar3->propensity_signal_,(shared_ptr<Reaction> *)(local_30 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_);
  }
  pSVar3 = SpeciesTracker::Instance();
  SpeciesTracker::Increment(pSVar3,&(local_50->super_MobileElement).name_,-1);
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  if ((element_type *)local_30._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_);
  }
  return;
}

Assistant:

void BindPolymerase::Execute() {
  auto polymer = ChoosePolymer();
  auto new_pol = std::make_shared<Polymerase>(pol_template_);
  polymer->Bind(new_pol, promoter_name_);
  SpeciesTracker::Instance().propensity_signal_.Emit(polymer->wrapper());
  // Polymer should handle decrementing promoter
  SpeciesTracker::Instance().Increment(new_pol->name(), -1);
}